

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O3

err_t btokCVCUnwrap(btok_cvc_t *cvc,octet *cert,size_t cert_len,octet *pubkey,size_t pubkey_len)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  bool_t bVar4;
  err_t eVar5;
  size_t sVar6;
  size_t sVar7;
  octet *poVar8;
  size_t sVar9;
  size_t sVar10;
  octet *poVar11;
  octet *der;
  size_t len;
  der_anchor_t CertHAT [1];
  der_anchor_t CVCert [1];
  der_anchor_t DDT [1];
  der_anchor_t CVExt [1];
  der_anchor_t PubKey [1];
  der_anchor_t CertBody [1];
  octet *local_120;
  ulong local_108;
  octet *local_100;
  der_anchor_t local_f8;
  der_anchor_t local_d8;
  der_anchor_t local_b8;
  der_anchor_t local_98;
  der_anchor_t local_78;
  der_anchor_t local_58;
  
  bVar4 = memIsValid(cvc,0x128);
  if (bVar4 == 0) {
    return 0x6d;
  }
  if (8 < (pubkey_len << 0x3c | pubkey_len >> 4)) {
    return 0x6d;
  }
  if ((0x159UL >> (pubkey_len >> 4 & 0x3f) & 1) == 0) {
    return 0x6d;
  }
  poVar11 = cvc->pubkey;
  if ((pubkey != (octet *)0x0 && pubkey_len == 0) && poVar11 != pubkey) {
    return 0x6d;
  }
  bVar4 = memIsValid(cert,cert_len);
  if (bVar4 == 0) {
    return 0x6d;
  }
  bVar4 = memIsValid(pubkey,pubkey_len);
  if (bVar4 == 0) {
    return 0x6d;
  }
  bVar4 = memIsDisjoint2(cvc,0x128,cert,cert_len);
  if (bVar4 == 0) {
    return 0x6d;
  }
  bVar4 = memIsDisjoint2(cvc,0x128,pubkey,pubkey_len);
  if (bVar4 == 0) {
    return 0x6d;
  }
  memSet(cvc,'\0',0x128);
  sVar6 = derTSEQDecStart(&local_d8,cert,cert_len,0x7f21);
  if (sVar6 != 0xffffffffffffffff) {
    poVar8 = cert + sVar6;
    if (cert == (octet *)0x0) {
      poVar8 = (octet *)0x0;
    }
    sVar6 = cert_len - sVar6;
    memSet(cvc,'\0',0x128);
    local_100 = poVar8;
    sVar7 = derTSEQDecStart(&local_58,poVar8,sVar6,0x7f4e);
    if (sVar7 != 0xffffffffffffffff) {
      poVar8 = local_100 + sVar7;
      sVar9 = derTSIZEDec2(poVar8,sVar6 - sVar7,0x5f29,0);
      if (sVar9 != 0xffffffffffffffff) {
        poVar8 = poVar8 + sVar9;
        sVar9 = (sVar6 - sVar7) - sVar9;
        sVar7 = derTPSTRDec((char *)0x0,&local_108,poVar8,sVar9,0x42);
        if (((sVar7 != 0xffffffffffffffff) && (0xfffffffffffffffa < local_108 - 0xd)) &&
           (sVar7 = derTPSTRDec(cvc->authority,(size_t *)0x0,poVar8,sVar9,0x42),
           sVar7 != 0xffffffffffffffff)) {
          poVar8 = poVar8 + sVar7;
          sVar10 = derTSEQDecStart(&local_78,poVar8,sVar9 - sVar7,0x7f49);
          if (sVar10 != 0xffffffffffffffff) {
            sVar9 = (sVar9 - sVar7) - sVar10;
            sVar7 = derOIDDec2(poVar8 + sVar10,sVar9,"1.2.112.0.2.0.34.101.45.2.1");
            if (sVar7 != 0xffffffffffffffff) {
              poVar8 = poVar8 + sVar10 + sVar7;
              sVar9 = sVar9 - sVar7;
              sVar7 = derTBITDec((octet *)0x0,&local_108,poVar8,sVar9,3);
              if (((sVar7 != 0xffffffffffffffff) &&
                  (uVar1 = local_108 - 0x180 >> 7, (local_108 << 0x39 | uVar1) < 6)) &&
                 ((0x2bUL >> (uVar1 & 0x3f) & 1) != 0)) {
                cvc->pubkey_len = local_108 >> 3;
                sVar7 = derTBITDec(poVar11,(size_t *)0x0,poVar8,sVar9,3);
                if (sVar7 != 0xffffffffffffffff) {
                  sVar10 = derTSEQDecStop(poVar8 + sVar7,&local_78);
                  if (sVar10 != 0xffffffffffffffff) {
                    local_120 = poVar8 + sVar7 + sVar10;
                    sVar9 = sVar9 - (sVar7 + sVar10);
                    sVar7 = derTPSTRDec((char *)0x0,&local_108,local_120,sVar9,0x5f20);
                    if (((sVar7 != 0xffffffffffffffff) && (0xfffffffffffffffa < local_108 - 0xd)) &&
                       (sVar7 = derTPSTRDec(cvc->holder,(size_t *)0x0,local_120,sVar9,0x5f20),
                       sVar7 != 0xffffffffffffffff)) {
                      local_120 = local_120 + sVar7;
                      sVar9 = sVar9 - sVar7;
                      bVar4 = derStartsWith(local_120,sVar9,0x7f4c);
                      if (bVar4 != 0) {
                        sVar7 = derTSEQDecStart(&local_f8,local_120,sVar9,0x7f4c);
                        if (sVar7 == 0xffffffffffffffff) {
                          return 0x132;
                        }
                        local_120 = local_120 + sVar7;
                        sVar10 = derOIDDec2(local_120,sVar9 - sVar7,"1.2.112.0.2.0.34.101.79.6.1");
                        if (sVar10 == 0xffffffffffffffff) {
                          return 0x132;
                        }
                        sVar9 = (sVar9 - sVar7) - sVar10;
                        local_120 = local_120 + sVar10;
                        sVar7 = derTOCTDec2(cvc->hat_eid,local_120,sVar9,4,5);
                        if (sVar7 == 0xffffffffffffffff) {
                          return 0x132;
                        }
                        sVar10 = derTSEQDecStop(local_120 + sVar7,&local_f8);
                        if (sVar10 == 0xffffffffffffffff) {
                          return 0x132;
                        }
                        local_120 = local_120 + sVar7 + sVar10;
                        sVar9 = sVar9 - (sVar7 + sVar10);
                      }
                      sVar7 = derTOCTDec2(cvc->from,local_120,sVar9,0x5f25,6);
                      if (sVar7 != 0xffffffffffffffff) {
                        sVar10 = derTOCTDec2(cvc->until,local_120 + sVar7,sVar9 - sVar7,0x5f24,6);
                        if (sVar10 != 0xffffffffffffffff) {
                          poVar8 = local_120 + sVar7 + sVar10;
                          sVar10 = (sVar9 - sVar7) - sVar10;
                          bVar4 = derStartsWith(poVar8,sVar10,0x65);
                          if (bVar4 != 0) {
                            sVar7 = derTSEQDecStart(&local_98,poVar8,sVar10,0x65);
                            if (sVar7 == 0xffffffffffffffff) {
                              return 0x132;
                            }
                            poVar8 = poVar8 + sVar7;
                            sVar9 = derTSEQDecStart(&local_b8,poVar8,sVar10 - sVar7,0x73);
                            if (sVar9 == 0xffffffffffffffff) {
                              return 0x132;
                            }
                            sVar10 = (sVar10 - sVar7) - sVar9;
                            poVar8 = poVar8 + sVar9;
                            sVar7 = derOIDDec2(poVar8,sVar10,"1.2.112.0.2.0.34.101.79.8.1");
                            if (sVar7 == 0xffffffffffffffff) {
                              return 0x132;
                            }
                            sVar10 = sVar10 - sVar7;
                            poVar8 = poVar8 + sVar7;
                            sVar7 = derTSEQDecStart(&local_f8,poVar8,sVar10,0x7f4c);
                            if (sVar7 == 0xffffffffffffffff) {
                              return 0x132;
                            }
                            sVar10 = sVar10 - sVar7;
                            poVar8 = poVar8 + sVar7;
                            sVar7 = derOIDDec2(poVar8,sVar10,"1.2.112.0.2.0.34.101.79.6.2");
                            if (sVar7 == 0xffffffffffffffff) {
                              return 0x132;
                            }
                            poVar8 = poVar8 + sVar7;
                            sVar7 = derTOCTDec2(cvc->hat_esign,poVar8,sVar10 - sVar7,4,2);
                            if (sVar7 == 0xffffffffffffffff) {
                              return 0x132;
                            }
                            poVar8 = poVar8 + sVar7;
                            sVar7 = derTSEQDecStop(poVar8,&local_f8);
                            if (sVar7 == 0xffffffffffffffff) {
                              return 0x132;
                            }
                            poVar8 = poVar8 + sVar7;
                            sVar7 = derTSEQDecStop(poVar8,&local_b8);
                            if (sVar7 == 0xffffffffffffffff) {
                              return 0x132;
                            }
                            sVar9 = derTSEQDecStop(poVar8 + sVar7,&local_98);
                            if (sVar9 == 0xffffffffffffffff) {
                              return 0x132;
                            }
                            poVar8 = poVar8 + sVar7 + sVar9;
                          }
                          sVar7 = derTSEQDecStop(poVar8,&local_58);
                          if ((sVar7 != 0xffffffffffffffff) &&
                             (poVar8 = poVar8 + (sVar7 - (long)local_100),
                             poVar8 != (octet *)0xffffffffffffffff)) {
                            der = local_100 + (long)poVar8;
                            if (local_100 == (octet *)0x0) {
                              der = (octet *)0x0;
                            }
                            sVar6 = sVar6 - (long)poVar8;
                            if ((pubkey_len == 0) &&
                               ((poVar11 != pubkey ||
                                (pubkey_len = cvc->pubkey_len, pubkey_len == 0)))) {
                              pubkey_len = 0;
                              sVar7 = 0x22;
                              sVar9 = derDec3((octet **)0x0,der,sVar6,0x5f37,0x22);
                              bVar3 = true;
                              bVar2 = true;
                              if (sVar9 == 0xffffffffffffffff) {
                                pubkey_len = 0;
                                sVar7 = 0x30;
                                sVar9 = derDec3((octet **)0x0,der,sVar6,0x5f37,0x30);
                                bVar2 = bVar3;
                                if (sVar9 == 0xffffffffffffffff) {
                                  pubkey_len = 0;
                                  sVar7 = 0x48;
                                  sVar9 = derDec3((octet **)0x0,der,sVar6,0x5f37,0x48);
                                  if (sVar9 == 0xffffffffffffffff) {
                                    pubkey_len = 0;
                                    sVar7 = 0x60;
                                    sVar9 = derDec3((octet **)0x0,der,sVar6,0x5f37,0x60);
                                    if (sVar9 == 0xffffffffffffffff) {
                                      return 0x132;
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              sVar7 = 0x22;
                              if (pubkey_len != 0x30) {
                                sVar7 = pubkey_len - (pubkey_len >> 2);
                              }
                              bVar2 = false;
                            }
                            cvc->sig_len = sVar7;
                            sVar7 = derTOCTDec2(cvc->sig,der,sVar6,0x5f37,sVar7);
                            if (sVar7 != 0xffffffffffffffff) {
                              poVar11 = der + sVar7;
                              if (der == (octet *)0x0) {
                                poVar11 = (octet *)0x0;
                              }
                              if ((!bVar2) &&
                                 (eVar5 = btokVerify(local_100,(size_t)poVar8,cvc->sig,pubkey,
                                                     pubkey_len), eVar5 != 0)) {
                                return eVar5;
                              }
                              sVar9 = derTSEQDecStop(poVar11,&local_d8);
                              if (sVar9 != 0xffffffffffffffff) {
                                if (sVar6 == sVar9 + sVar7) {
                                  eVar5 = btokCVCCheck(cvc);
                                  return eVar5;
                                }
                                return 0x132;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 0x132;
}

Assistant:

err_t btokCVCUnwrap(btok_cvc_t* cvc, const octet cert[], size_t cert_len,
	const octet pubkey[], size_t pubkey_len)
{
	err_t code;
	der_anchor_t CVCert[1];
	size_t t;
	const octet* body;
	size_t body_len;
	// проверить входные данные
	if (!memIsValid(cvc, sizeof(btok_cvc_t)) ||
		pubkey_len != 0 && pubkey_len != 48 &&
			pubkey_len != 64 && pubkey_len != 96 &&	pubkey_len != 128 ||
		pubkey_len == 0 && pubkey != 0 && pubkey != cvc->pubkey ||
		!memIsValid(cert, cert_len) ||
		!memIsValid(pubkey, pubkey_len) ||
		!memIsDisjoint2(cvc, sizeof(btok_cvc_t), cert, cert_len) ||
		!memIsDisjoint2(cvc, sizeof(btok_cvc_t), pubkey, pubkey_len))
		return ERR_BAD_INPUT;
	// подготовить cvc
	memSetZero(cvc, sizeof(btok_cvc_t));
	// начать декодирование...
	t = derTSEQDecStart(CVCert, cert, cert_len, 0x7F21);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	cert = cert ? cert + t : 0, cert_len -= t;
	// ...декодировать основную часть...
	t = btokCVCBodyDec(cvc, cert, cert_len);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	body = cert, body_len = t;
	cert = cert ? cert + t : 0, cert_len -= t;
	// ...определить длину подписи...
	if (pubkey_len == 0 && pubkey == cvc->pubkey)
		pubkey_len = cvc->pubkey_len;
	if (pubkey_len == 0)
	{
		size_t sig_len;
		if (derDec3(0, cert, cert_len, 0x5F37, sig_len = 34) == SIZE_MAX &&
			derDec3(0, cert, cert_len, 0x5F37, sig_len = 48) == SIZE_MAX &&
			derDec3(0, cert, cert_len, 0x5F37, sig_len = 72) == SIZE_MAX &&
			derDec3(0, cert, cert_len, 0x5F37, sig_len = 96) == SIZE_MAX)
			return ERR_BAD_FORMAT;
		cvc->sig_len = sig_len;
	}
	else
		cvc->sig_len = pubkey_len == 48 ? 34 : pubkey_len - pubkey_len / 4;
	// ...декодировать подпись...
	t = derTOCTDec2(cvc->sig, cert, cert_len, 0x5F37, cvc->sig_len);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	cert = cert ? cert + t : 0, cert_len -= t;
	// ...проверить подпись...
	if (pubkey_len)
	{
		code = btokVerify(body, body_len, cvc->sig, pubkey, pubkey_len);
		ERR_CALL_CHECK(code);
	}
	// ...завершить декодирование
	t = derTSEQDecStop(cert, CVCert);
	if (t == SIZE_MAX)
		return ERR_BAD_FORMAT;
	cert = cert ? cert + t : 0, cert_len -= t;
	if (cert_len != 0)
		return ERR_BAD_FORMAT;
	// окончательная проверка cvc
	return btokCVCCheck(cvc);
}